

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> * __thiscall
args::Group::GetAllFlags
          (vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *__return_storage_ptr__,
          Group *this)

{
  bool bVar1;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *this_00;
  reference ppBVar2;
  iterator __first;
  iterator __last;
  __normal_iterator<args::FlagBase_**,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
  local_78;
  const_iterator local_70;
  undefined1 local_58 [8];
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> childRes;
  Base *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range2;
  Group *this_local;
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *res;
  
  std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::vector(__return_storage_ptr__);
  this_00 = Children(this);
  __end2 = std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin(this_00);
  child = (Base *)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                                     *)&child), bVar1) {
    ppBVar2 = __gnu_cxx::
              __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
              ::operator*(&__end2);
    childRes.super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*ppBVar2;
    (*((Base *)childRes.super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage)->_vptr_Base[9])(local_58);
    local_78._M_current =
         (FlagBase **)
         std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::end
                   (__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<args::FlagBase*const*,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>
    ::__normal_iterator<args::FlagBase**>
              ((__normal_iterator<args::FlagBase*const*,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>
                *)&local_70,&local_78);
    __first = std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::begin
                        ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)local_58);
    __last = std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::end
                       ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)local_58);
    std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>::
    insert<__gnu_cxx::__normal_iterator<args::FlagBase**,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>,void>
              ((vector<args::FlagBase*,std::allocator<args::FlagBase*>> *)__return_storage_ptr__,
               local_70,(__normal_iterator<args::FlagBase_**,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
                         )__first._M_current,
               (__normal_iterator<args::FlagBase_**,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
                )__last._M_current);
    std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::~vector
              ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)local_58);
    __gnu_cxx::
    __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<FlagBase*> GetAllFlags() override
            {
                std::vector<FlagBase*> res;
                for (Base *child: Children())
                {
                    auto childRes = child->GetAllFlags();
                    res.insert(res.end(), childRes.begin(), childRes.end());
                }
                return res;
            }